

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter> __thiscall
Catch::createReporter(Catch *this,string *reporterName,Ptr<Catch::Config> *config)

{
  Ptr<Catch::Config> *pPVar1;
  bool bVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  Config *p;
  IStreamingReporter *p_00;
  ostream *poVar5;
  domain_error *this_00;
  string local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream oss;
  Ptr<const_Catch::IConfig> local_30;
  undefined1 local_21;
  Ptr<Catch::Config> *local_20;
  Ptr<Catch::Config> *config_local;
  string *reporterName_local;
  Ptr<Catch::IStreamingReporter> *reporter;
  
  local_21 = 0;
  local_20 = config;
  config_local = (Ptr<Catch::Config> *)reporterName;
  reporterName_local = (string *)this;
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[2])();
  pPVar1 = config_local;
  p = Ptr<Catch::Config>::get(local_20);
  Ptr<const_Catch::IConfig>::Ptr(&local_30,(IConfig *)p);
  p_00 = (IStreamingReporter *)
         (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                   ((long *)CONCAT44(extraout_var,iVar3),pPVar1,&local_30);
  Ptr<Catch::IStreamingReporter>::Ptr((Ptr<Catch::IStreamingReporter> *)this,p_00);
  Ptr<const_Catch::IConfig>::~Ptr(&local_30);
  bVar2 = Ptr<Catch::IStreamingReporter>::operator!((Ptr<Catch::IStreamingReporter> *)this);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar5 = std::operator<<((ostream *)local_1b8,"No reporter registered with name: \'");
    poVar5 = std::operator<<(poVar5,(string *)config_local);
    std::operator<<(poVar5,"\'");
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::domain_error::domain_error(this_00,local_1d8);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> createReporter(std::string const& reporterName, Ptr<Config> const& config) {
		Ptr<IStreamingReporter> reporter = getRegistryHub().getReporterRegistry().create(reporterName, config.get());
		if (!reporter) {
			std::ostringstream oss;
			oss << "No reporter registered with name: '" << reporterName << "'";
			throw std::domain_error(oss.str());
		}
		return reporter;
	}